

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

float linalg::dot<float,4>(vec<float,_4> *a,vec<float,_4> *b)

{
  scalar_t<linalg::vec<float,_4>_> sVar1;
  no_mm_apply_t<detail::op_mul,_linalg::vec<float,_4>,_linalg::vec<float,_4>_> local_28;
  vec<float,_4> *local_18;
  vec<float,_4> *b_local;
  vec<float,_4> *a_local;
  
  local_18 = b;
  b_local = a;
  local_28 = operator*(a,b);
  sVar1 = sum<linalg::vec<float,4>>(&local_28);
  return sVar1;
}

Assistant:

constexpr vec<T,3> cross    (const vec<T,3> & a, const vec<T,3> & b)      { return {a.y*b.z-a.z*b.y, a.z*b.x-a.x*b.z, a.x*b.y-a.y*b.x}; }